

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

size_t pstore::sparse_array<int,pstore::uint128>::required_bytes<unsigned_long*>
                 (size_t count,unsigned_long *first,unsigned_long *last)

{
  uint128 x;
  bit_count *this;
  uint *puVar1;
  unsigned_long *in_RCX;
  undefined1 in_stack_ffffffffffffffb8 [12];
  uint in_stack_ffffffffffffffc4;
  uint local_28 [2];
  unsigned_long *puStack_20;
  uint elements;
  unsigned_long *last_local;
  unsigned_long *first_local;
  size_t count_local;
  
  puStack_20 = last;
  last_local = first;
  first_local = (unsigned_long *)count;
  this = (bit_count *)
         bitmap<unsigned_long*,void>
                   ((uint128 *)first,(sparse_array<int,pstore::uint128> *)last,last,in_RCX);
  x.v_._12_4_ = in_stack_ffffffffffffffc4;
  x.v_._0_12_ = in_stack_ffffffffffffffb8;
  local_28[0] = bit_count::pop_count(this,x);
  puVar1 = std::max<unsigned_int>(local_28,(uint *)&stack0xffffffffffffffc4);
  return (long)first_local + (ulong)*puVar1 * 4 + -4;
}

Assistant:

static std::size_t required_bytes (std::size_t const count, InputIterator const first,
                                           InputIterator const last) {
            // There will always be sufficient storage for at least 1 instance of
            // ValueType (this comes from the built-in array).
            static_assert (sizeof (elements_) / sizeof (ValueType) == 1U,
                           "Expected elements_ to be an array of 1 ValueType");
            auto const elements = std::max (bit_count::pop_count (bitmap (first, last)), 1U);
            return count - sizeof (elements_) + elements * sizeof (ValueType);
        }